

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

WaitForLineResult
cmSystemTools::WaitForLine
          (uv_loop_t *loop,uv_stream_t *outPipe,uv_stream_t *errPipe,string *line,cmDuration timeout
          ,vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  char cVar1;
  pointer pcVar2;
  long lVar3;
  pointer pcVar4;
  bool bVar5;
  vector<char,std::allocator<char>> *pvVar6;
  ulong uVar7;
  pointer pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  difference_type __offset;
  char *pcVar13;
  difference_type __offset_1;
  char *pcVar14;
  double dVar15;
  cmProcessOutput processOutput;
  bool timedOut;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> errHandle;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outHandle;
  string strdata;
  ReadData outData;
  uv_timer_ptr timer;
  ReadData errData;
  cmProcessOutput local_13a;
  char local_139;
  vector<char,std::allocator<char>> *local_138;
  cmUVStreamReadHandle *local_130;
  cmUVStreamReadHandle *local_128;
  string *local_120;
  string local_118;
  double local_f8;
  uv_stream_t *local_e8;
  uv_stream_t *local_e0;
  uv_loop_t *local_d8;
  ReadData local_d0;
  uv_handle_ptr_base_<uv_timer_s> local_a8;
  string local_98;
  string local_78;
  ReadData local_58;
  
  line->_M_string_length = 0;
  *(line->_M_dataplus)._M_p = '\0';
  pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_138 = (vector<char,std::allocator<char>> *)err;
  local_120 = line;
  local_f8 = timeout.__r;
  local_e8 = errPipe;
  local_e0 = outPipe;
  local_d8 = loop;
  cmProcessOutput::cmProcessOutput(&local_13a,Auto,0x400);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  dVar15 = local_f8 * 1000.0;
  uVar7 = (ulong)dVar15;
  do {
    pvVar6 = local_138;
    pcVar14 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish;
    pcVar13 = pcVar10;
    if (pcVar10 != pcVar14) {
      lVar12 = 0;
      do {
        pcVar11 = pcVar10 + lVar12 + 1;
        cVar1 = pcVar10[lVar12];
        if (cVar1 == '\r') {
          if (pcVar11 == pcVar14) {
            pcVar13 = pcVar10 + lVar12;
            break;
          }
        }
        else if ((cVar1 == '\0') || (cVar1 == '\n')) {
          pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar9 = pcVar10 + (lVar12 - (long)pcVar8);
          if ((char *)0x1 < pcVar9) {
            pcVar9 = pcVar10 + (lVar12 - (long)(pcVar8 + (pcVar10[lVar12 + -1] == '\r')));
          }
          if (pcVar9 != (char *)0x0) {
            std::__cxx11::string::append((char *)local_120,(ulong)pcVar8);
          }
          pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_f8 = (double)CONCAT44(local_f8._4_4_,1);
          if (pcVar11 != pcVar9) {
            pcVar14 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
            if (pcVar11 != pcVar14) {
              memmove(pcVar9,pcVar11,(size_t)(pcVar14 + (~(ulong)pcVar10 - lVar12)));
            }
            pcVar14 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
            if (pcVar9 + (long)pcVar14 + (~(ulong)pcVar10 - lVar12) != pcVar14) {
              (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish = pcVar9 + (long)pcVar14 + (~(ulong)pcVar10 - lVar12);
            }
          }
          goto LAB_00116fc0;
        }
        lVar12 = lVar12 + 1;
        pcVar13 = pcVar14;
      } while (pcVar11 != pcVar14);
    }
    pcVar10 = *(char **)(local_138 + 8);
    pcVar14 = pcVar9;
    if (pcVar9 != pcVar10) {
      lVar12 = 0;
      do {
        pcVar11 = pcVar9 + lVar12 + 1;
        cVar1 = pcVar9[lVar12];
        if (cVar1 == '\r') {
          if (pcVar11 == pcVar10) {
            pcVar14 = pcVar9 + lVar12;
            break;
          }
        }
        else if ((cVar1 == '\0') || (cVar1 == '\n')) {
          uVar7 = *(ulong *)local_138;
          pcVar10 = pcVar9 + (lVar12 - uVar7);
          if ((char *)0x1 < pcVar10) {
            pcVar10 = pcVar9 + (lVar12 - ((pcVar9[lVar12 + -1] == '\r') + uVar7));
          }
          if (pcVar10 != (char *)0x0) {
            std::__cxx11::string::append((char *)local_120,uVar7);
          }
          pcVar10 = *(char **)pvVar6;
          local_f8 = (double)CONCAT44(local_f8._4_4_,2);
          if (pcVar11 != pcVar10) {
            if (pcVar11 != *(char **)(pvVar6 + 8)) {
              memmove(pcVar10,pcVar11,(size_t)(*(char **)(pvVar6 + 8) + (~(ulong)pcVar9 - lVar12)));
            }
            if (pcVar10 + (long)*(char **)(pvVar6 + 8) + (~(ulong)pcVar9 - lVar12) !=
                *(char **)(pvVar6 + 8)) {
              *(char **)(pvVar6 + 8) =
                   pcVar10 + (long)*(char **)(pvVar6 + 8) + (~(ulong)pcVar9 - lVar12);
            }
          }
          goto LAB_00116fc0;
        }
        lVar12 = lVar12 + 1;
        pcVar14 = pcVar10;
      } while (pcVar11 != pcVar10);
    }
    local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_2_ = 0;
    local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._2_6_ = 0;
    local_d0.Read = false;
    local_d0.Finished = false;
    local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_2_ = 0;
    local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish._2_6_ = 0;
    WaitForLine::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&local_128,local_e0,&local_d0);
    local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_2_ = 0;
    local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._2_6_ = 0;
    local_58.Read = false;
    local_58.Finished = false;
    local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_2_ = 0;
    local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish._2_6_ = 0;
    WaitForLine::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&local_130,local_e8,&local_58);
    local_a8.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a8.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_139 = '\0';
    cm::uv_timer_ptr::init((uv_timer_ptr *)&local_a8,(EVP_PKEY_CTX *)local_d8);
    cm::uv_timer_ptr::start
              ((uv_timer_ptr *)&local_a8,WaitForLine::anon_class_1_0_00000001::__invoke,
               (long)(dVar15 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7,0);
    uv_run(local_d8,UV_RUN_ONCE);
    if (local_139 != '\0') {
      local_f8 = (double)CONCAT44(local_f8._4_4_,3);
      goto LAB_00116b57;
    }
    if (local_d0.Read == true) {
      cmProcessOutput::DecodeText
                (&local_13a,
                 local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 CONCAT62(local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish._2_6_,
                          local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish._0_2_) -
                 (long)local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,&local_118,1);
      pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<char,std::allocator<char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((vector<char,std::allocator<char>> *)out);
      pcVar13 = pcVar8 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                super__Vector_impl_data._M_start - (long)pcVar2);
LAB_00116d9c:
      if (local_d0.Finished == false) {
        uv_read_stop(local_e0);
      }
      bVar5 = true;
      if (local_58.Finished == false) {
        uv_read_stop(local_e8);
      }
    }
    else {
      if (local_58.Read == true) {
        cmProcessOutput::DecodeText
                  (&local_13a,
                   local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   CONCAT62(local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish._2_6_,
                            local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_2_) -
                   (long)local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,&local_118,2);
        pvVar6 = local_138;
        lVar12 = *(long *)(local_138 + 8);
        lVar3 = *(long *)local_138;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(local_138);
        pcVar14 = (char *)((lVar12 - lVar3) + *(long *)pvVar6);
        goto LAB_00116d9c;
      }
      if ((local_d0.Finished != true) || (local_58.Finished != true)) goto LAB_00116d9c;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      cmProcessOutput::DecodeText(&local_13a,&local_78,&local_118,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      if (local_118._M_string_length != 0) {
        pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((vector<char,std::allocator<char>> *)out,pcVar8,local_118._M_dataplus._M_p,
                   local_118._M_dataplus._M_p + local_118._M_string_length);
        pcVar13 = pcVar8 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data._M_start - (long)pcVar2);
      }
      local_98._M_string_length = 0;
      local_98.field_2._M_local_buf[0] = '\0';
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      cmProcessOutput::DecodeText(&local_13a,&local_98,&local_118,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                 local_98.field_2._M_local_buf[0]) + 1);
      }
      pvVar6 = local_138;
      if (local_118._M_string_length != 0) {
        lVar12 = *(long *)(local_138 + 8);
        lVar3 = *(long *)local_138;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(local_138);
        pcVar14 = (char *)((lVar12 - lVar3) + *(long *)pvVar6);
      }
      pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar8 == (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        if (*(pointer *)local_138 != *(pointer *)(local_138 + 8)) {
          std::__cxx11::string::append((char *)local_120,(ulong)*(pointer *)local_138);
          local_f8 = (double)CONCAT44(local_f8._4_4_,2);
          if ((*(pointer *)local_138 != *(pointer *)(local_138 + 8)) &&
             (pcVar8 = *(pointer *)local_138 +
                       ((long)*(pointer *)(local_138 + 8) - (long)*(pointer *)(local_138 + 8)),
             *(pointer *)(local_138 + 8) != pcVar8)) {
            *(pointer *)(local_138 + 8) = pcVar8;
          }
          goto LAB_00116b57;
        }
        bVar5 = false;
        local_f8 = (double)((ulong)local_f8 & 0xffffffff00000000);
      }
      else {
        std::__cxx11::string::append((char *)local_120,(ulong)pcVar8);
        pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        local_f8 = (double)CONCAT44(local_f8._4_4_,1);
        if ((pcVar8 != pcVar2) &&
           (pcVar4 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish,
           pcVar8 = pcVar8 + ((long)pcVar4 - (long)pcVar2), pcVar4 != pcVar8)) {
          (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish = pcVar8;
        }
LAB_00116b57:
        bVar5 = false;
      }
    }
    cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_(&local_a8);
    if (local_130 != (cmUVStreamReadHandle *)0x0) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)&local_130,local_130);
    }
    if (local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (char *)0x0) {
      operator_delete(local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT62(local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                               local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) -
                      (long)local_58.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_128 != (cmUVStreamReadHandle *)0x0) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)&local_128,local_128);
    }
    if (local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (char *)0x0) {
      operator_delete(local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT62(local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                               local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) -
                      (long)local_d0.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pcVar10 = pcVar13;
    pcVar9 = pcVar14;
    if (!bVar5) {
LAB_00116fc0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      return local_f8._0_4_;
    }
  } while( true );
}

Assistant:

cmSystemTools::WaitForLineResult cmSystemTools::WaitForLine(
  uv_loop_t* loop, uv_stream_t* outPipe, uv_stream_t* errPipe,
  std::string& line, cmDuration timeout, std::vector<char>& out,
  std::vector<char>& err)
{
  line.clear();
  auto outiter = out.begin();
  auto erriter = err.begin();
  cmProcessOutput processOutput;
  std::string strdata;
  while (true) {
    // Check for a newline in stdout.
    for (; outiter != out.end(); ++outiter) {
      if ((*outiter == '\r') && ((outiter + 1) == out.end())) {
        break;
      }
      if (*outiter == '\n' || *outiter == '\0') {
        std::vector<char>::size_type length = outiter - out.begin();
        if (length > 1 && *(outiter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(out.data(), length);
        }
        out.erase(out.begin(), outiter + 1);
        return WaitForLineResult::STDOUT;
      }
    }

    // Check for a newline in stderr.
    for (; erriter != err.end(); ++erriter) {
      if ((*erriter == '\r') && ((erriter + 1) == err.end())) {
        break;
      }
      if (*erriter == '\n' || *erriter == '\0') {
        std::vector<char>::size_type length = erriter - err.begin();
        if (length > 1 && *(erriter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(err.data(), length);
        }
        err.erase(err.begin(), erriter + 1);
        return WaitForLineResult::STDERR;
      }
    }

    // No newlines found.  Wait for more data from the process.
    struct ReadData
    {
      uv_stream_t* Stream;
      std::vector<char> Buffer;
      bool Read = false;
      bool Finished = false;
    };
    auto startRead =
      [](uv_stream_t* stream,
         ReadData& data) -> std::unique_ptr<cmUVStreamReadHandle> {
      data.Stream = stream;
      return cmUVStreamRead(
        stream,
        [&data](std::vector<char> buf) {
          data.Buffer = std::move(buf);
          data.Read = true;
          uv_read_stop(data.Stream);
        },
        [&data]() { data.Finished = true; });
    };
    ReadData outData;
    auto outHandle = startRead(outPipe, outData);
    ReadData errData;
    auto errHandle = startRead(errPipe, errData);

    cm::uv_timer_ptr timer;
    bool timedOut = false;
    timer.init(*loop, &timedOut);
    timer.start(
      [](uv_timer_t* handle) {
        auto* timedOutPtr = static_cast<bool*>(handle->data);
        *timedOutPtr = true;
      },
      static_cast<uint64_t>(timeout.count() * 1000.0), 0);

    uv_run(loop, UV_RUN_ONCE);
    if (timedOut) {
      // Timeout has been exceeded.
      return WaitForLineResult::Timeout;
    }
    if (outData.Read) {
      processOutput.DecodeText(outData.Buffer.data(), outData.Buffer.size(),
                               strdata, 1);
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      cm::append(out, strdata);
      outiter = out.begin() + size;
    } else if (errData.Read) {
      processOutput.DecodeText(errData.Buffer.data(), errData.Buffer.size(),
                               strdata, 2);
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      cm::append(err, strdata);
      erriter = err.begin() + size;
    } else if (outData.Finished && errData.Finished) {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = out.size();
        cm::append(out, strdata);
        outiter = out.begin() + size;
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = err.size();
        cm::append(err, strdata);
        erriter = err.begin() + size;
      }
      if (!out.empty()) {
        line.append(out.data(), outiter - out.begin());
        out.erase(out.begin(), out.end());
        return WaitForLineResult::STDOUT;
      }
      if (!err.empty()) {
        line.append(err.data(), erriter - err.begin());
        err.erase(err.begin(), err.end());
        return WaitForLineResult::STDERR;
      }
      return WaitForLineResult::None;
    }
    if (!outData.Finished) {
      uv_read_stop(outPipe);
    }
    if (!errData.Finished) {
      uv_read_stop(errPipe);
    }
  }
}